

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system-alloc.cc
# Opt level: O0

void TCMalloc_SystemCommit(void *start,size_t length)

{
  size_t length_local;
  void *start_local;
  
  return;
}

Assistant:

void TCMalloc_SystemCommit(void* start, size_t length) {
#if defined(FREE_MMAP_PROT_NONE) && defined(HAVE_MMAP)
  // remaping as MAP_FIXED to same address assuming span size did not change 
  // since last TCMalloc_SystemRelease
  mmap(start, length, PROT_READ|PROT_WRITE, MAP_PRIVATE|MAP_ANONYMOUS|MAP_FIXED,
       -1, 0);
#else
  // Nothing to do here.  TCMalloc_SystemRelease does not alter pages
  // such that they need to be re-committed before they can be used by the
  // application.
#endif
}